

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultAddMT
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  complex<double> *pcVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  double dVar8;
  TPZFMatrix<std::complex<double>_> *pTVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  complex<double> *pcVar13;
  TPZFYsmpMatrix<std::complex<double>_> *pTVar14;
  char *pcVar15;
  size_t __n;
  long lVar16;
  long lVar17;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  TPZFMatrix<std::complex<double>_> *in_XMM2_Qa;
  long in_XMM3_Qa;
  complex<double> aval;
  double local_c8;
  double dStack_c0;
  long local_b8;
  TPZFMatrix<std::complex<double>_> *local_b0;
  TPZFYsmpMatrix<std::complex<double>_> *local_a8;
  int local_9c;
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  TPZFMatrix<std::complex<double>_> *local_78;
  double dStack_70;
  long local_60;
  double local_58;
  double local_50;
  complex<double> local_48;
  
  local_58 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  lVar11 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_b0 = in_XMM2_Qa;
  local_78 = y;
  if (((lVar11 == (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) &&
      (lVar11 == (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) &&
     ((y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ==
      (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    local_9c = alpha._M_value._0_4_;
    local_88 = ZEXT816(0);
    local_98 = (double)(&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)
                       [local_9c != 0];
    local_b8 = in_XMM3_Qa;
    local_a8 = this;
    local_60 = lVar11;
    local_50 = in_XMM1_Qa;
    if (0 < lVar11) {
      __n = (long)local_98 << 4;
      lVar16 = 0;
      do {
        if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < 1) ||
           ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar16)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        pcVar4 = z->fElem;
        dVar8 = cabs((double)local_b0);
        lVar11 = local_60;
        if (1e-12 <= ABS(dVar8)) {
          if (z != local_78) {
            memcpy(pcVar4 + lVar12 * lVar16,local_78->fElem,__n);
          }
        }
        else {
          if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < 1) ||
             ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_98 != 0.0) {
            memset(z->fElem,0,__n);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar11 != lVar16);
    }
    local_b0 = x;
    if (local_9c == 0 && lVar11 == 1) {
      if (((local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
           (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) ||
         ((local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
          (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
        pcVar15 = 
        "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
        lVar11 = 0x4f;
        goto LAB_00d72813;
      }
      if (0 < (long)local_98) {
        lVar11 = 0;
        do {
          plVar5 = (local_a8->fIA).fStore;
          plVar6 = (local_a8->fJA).fStore;
          lVar16 = plVar5[lVar11];
          lVar12 = plVar5[lVar11 + 1];
          pcVar4 = local_b0->fElem;
          local_88 = ZEXT816(0);
          local_b8 = lVar11;
          if (lVar16 < lVar12) {
            pcVar13 = (local_a8->fA).fStore + lVar16;
            do {
              local_c8 = *(double *)pcVar13->_M_value;
              dStack_c0 = *(double *)(pcVar13->_M_value + 8);
              std::complex<double>::operator*=((complex<double> *)&local_c8,pcVar4 + plVar6[lVar16])
              ;
              dStack_c0 = dStack_c0 + (double)local_88._8_8_;
              local_88._8_4_ = SUB84(dStack_c0,0);
              local_88._0_8_ = local_c8 + (double)local_88._0_8_;
              local_88._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
              lVar16 = lVar16 + 1;
              pcVar13 = pcVar13 + 1;
            } while (lVar12 != lVar16);
          }
          local_c8 = local_58;
          dStack_c0 = local_50;
          std::complex<double>::operator*=((complex<double> *)&local_c8,(complex<double> *)local_88)
          ;
          if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= local_b8) ||
             ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            local_78 = (TPZFMatrix<std::complex<double>_> *)local_c8;
            dStack_70 = dStack_c0;
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar11 = local_b8 + 1;
          pcVar4 = z->fElem + local_b8;
          dVar8 = *(double *)(pcVar4->_M_value + 8);
          pcVar13 = z->fElem + local_b8;
          *(double *)pcVar13->_M_value = local_c8 + *(double *)pcVar4->_M_value;
          *(double *)(pcVar13->_M_value + 8) = dStack_c0 + dVar8;
        } while ((double)lVar11 != local_98);
      }
    }
    else if (0 < lVar11) {
      lVar11 = 0;
      pTVar14 = local_a8;
      do {
        if (local_9c == 0) {
          if (0 < (pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
            lVar16 = 0;
            do {
              pTVar9 = local_b0;
              local_88 = ZEXT816(0);
              plVar5 = (pTVar14->fIA).fStore;
              lVar17 = plVar5[lVar16];
              lVar12 = lVar16 + 1;
              local_b8 = lVar16;
              if (lVar17 < plVar5[lVar16 + 1]) {
                lVar16 = lVar17 << 4;
                do {
                  pdVar2 = (double *)(((pTVar14->fA).fStore)->_M_value + lVar16);
                  local_c8 = *pdVar2;
                  dStack_c0 = pdVar2[1];
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_c8,
                             pTVar9->fElem +
                             (pTVar9->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * lVar11 + (pTVar14->fJA).fStore[lVar17]);
                  dStack_c0 = dStack_c0 + (double)local_88._8_8_;
                  local_88._8_4_ = SUB84(dStack_c0,0);
                  local_88._0_8_ = local_c8 + (double)local_88._0_8_;
                  local_88._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                  lVar17 = lVar17 + 1;
                  lVar16 = lVar16 + 0x10;
                  pTVar14 = local_a8;
                } while (lVar17 < (local_a8->fIA).fStore[lVar12]);
              }
              local_c8 = local_58;
              dStack_c0 = local_50;
              std::complex<double>::operator*=
                        ((complex<double> *)&local_c8,(complex<double> *)local_88);
              if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= local_b8)
                 || ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar11)
                 ) {
                local_98 = local_c8;
                dStack_90 = dStack_c0;
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar16 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar11
              ;
              auVar3 = *(undefined1 (*) [16])z->fElem[lVar16 + local_b8]._M_value;
              pcVar4 = z->fElem + lVar16 + local_b8;
              *(double *)pcVar4->_M_value = local_c8 + auVar3._0_8_;
              *(double *)(pcVar4->_M_value + 8) = dStack_c0 + auVar3._8_8_;
              lVar16 = lVar12;
              pTVar14 = local_a8;
            } while (lVar12 < (local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                              .fRow);
          }
        }
        else {
          if (((pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
               (local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) ||
             ((pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
              (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n"
                       ,0x4e);
            return;
          }
          if (0 < (pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
            lVar16 = 0;
            do {
              plVar5 = (pTVar14->fIA).fStore;
              lVar12 = plVar5[lVar16];
              lVar17 = lVar16 + 1;
              local_b8 = lVar16;
              if (lVar12 < plVar5[lVar16 + 1]) {
                lVar16 = lVar12 << 4;
                do {
                  lVar7 = (pTVar14->fJA).fStore[lVar12];
                  if (lVar7 == -1) break;
                  puVar1 = (undefined8 *)(((pTVar14->fA).fStore)->_M_value + lVar16);
                  local_48._M_value._0_8_ = *puVar1;
                  local_48._M_value._8_8_ = puVar1[1];
                  local_c8 = local_58;
                  dStack_c0 = local_50;
                  std::complex<double>::operator*=((complex<double> *)&local_c8,&local_48);
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_c8,
                             local_b0->fElem +
                             (local_b0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow * lVar11 + local_b8);
                  if (((lVar7 < 0) ||
                      ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar7
                      )) || ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                             lVar11)) {
                    local_98 = local_c8;
                    dStack_90 = dStack_c0;
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar10 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                           lVar11;
                  auVar3 = *(undefined1 (*) [16])z->fElem[lVar10 + lVar7]._M_value;
                  pcVar4 = z->fElem + lVar10 + lVar7;
                  *(double *)pcVar4->_M_value = local_c8 + auVar3._0_8_;
                  *(double *)(pcVar4->_M_value + 8) = dStack_c0 + auVar3._8_8_;
                  lVar12 = lVar12 + 1;
                  lVar16 = lVar16 + 0x10;
                  pTVar14 = local_a8;
                } while (lVar12 < (local_a8->fIA).fStore[lVar17]);
              }
              lVar16 = lVar17;
            } while (lVar17 < (pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              fRow);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_60);
    }
    return;
  }
  pcVar15 = "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
  lVar11 = 0x53;
LAB_00d72813:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,lVar11);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultAddMT(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y,
									 TPZFMatrix<TVar> &z,
									 const TVar alpha,const TVar beta,const int opt )  {
	// computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot share storage
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || y.Rows() != z.Rows() )
	{
		cout << "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
		return;
	}
	
	int64_t  ir, ic, icol, xcols;
	xcols = x.Cols();
	TVar sum;
	int64_t  r = (opt) ? this->Cols() : this->Rows();
	
	// Determine how to initialize z
	for(ic=0; ic<xcols; ic++) {
		TVar *zp = &(z(0,ic));
		if(!IsZero(beta)){
			const TVar *yp = &(y.g(0,0));
			TVar *zlast = zp+r;

            if(&z != &y) {
				memcpy(zp,yp,r*sizeof(TVar));
			}
		} else {
			TVar *zp = &(z(0,0)), *zlast = zp+r;
			while(zp != zlast) {
				*zp = 0.;
				zp ++;
			}
		}
	}
	// Compute alpha * A * x
	if(xcols == 1 && opt == 0)
	{
		if(this->Cols() != x.Rows() || this->Rows() != y.Rows())
		{
			cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
			return;
		} 
		for(ir=0; ir<r; ir++) {
			int64_t icolmin = fIA[ir];
			int64_t icolmax = fIA[ir+1];
			const TVar *xptr = &(x.g(0,0));
			TVar *Aptr = &fA[0];
			int64_t *JAptr = &fJA[0];
			for(sum = 0.0, icol=icolmin; icol<icolmax; icol++ ) {
				sum += Aptr[icol] * xptr[JAptr[icol]];
			}
			z(ir,0) += alpha * sum;
		}
	}
	else 
	{
		for(ic=0; ic<xcols; ic++) {
			if(opt == 0) {
				
				for(ir=0; ir<this->Rows(); ir++) {
					for(sum = 0.0, icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						sum += fA[icol] * x.g((fJA[icol]),ic);
					}
					z(ir,ic) += alpha * sum;
				}
			}
			
			// Compute alpha * A^T * x
			else 
			{
				if (this->Rows() != x.Rows() || this->Cols() != y.Rows())
				{
					cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n";
					return; 
				}
				int64_t jc;
				int64_t icol;
				for(ir=0; ir<this->Rows(); ir++) {
					for(icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						if(fJA[icol]==-1) break; //Checa a exist�cia de dado ou n�
						jc = fJA[icol];
						TVar aval = fA[icol];
						//cout << "FA["<<icol<<"] = "<<aval<< " * x["<< ir<<"] ="<< x.Get(ir,ic)<< endl;
						z(jc,ic) += alpha * aval * x.g(ir,ic);
					}
				}
			}
		}
	}
}